

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode
JsInitializeModuleRecord
          (JsModuleRecord referencingModule,JsValueRef normalizedSpecifier,
          JsModuleRecord *moduleRecord)

{
  ScriptContext *scriptContext;
  JsErrorCode JVar1;
  JsrtContext *currentContext;
  SourceTextModuleRecord *pSVar2;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_68 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (moduleRecord == (JsModuleRecord *)0x0) {
    JVar1 = JsErrorNullArgument;
  }
  else {
    __enterScriptObject.library = (JavascriptLibrary *)moduleRecord;
    currentContext = JsrtContext::GetCurrent();
    pSVar2 = (SourceTextModuleRecord *)0x0;
    JVar1 = CheckContext(currentContext,true,false);
    if (JVar1 == JsNoError) {
      scriptContext =
           (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
           ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
      __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
      __entryExitRecord.scriptContext = (ScriptContext *)0x0;
      __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
      __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
      __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
      auStack_a8 = (undefined1  [8])0x0;
      __entryExitRecord._0_1_ = 0;
      __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
      __entryExitRecord._2_6_ = 0;
      Js::EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)local_68,scriptContext,(ScriptEntryExitRecord *)auStack_a8,
                 unaff_retaddr,&stack0x00000000,true,true,true);
      Js::ScriptContext::OnScriptStart(scriptContext,true,true);
      Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_68);
      pSVar2 = Js::SourceTextModuleRecord::Create(scriptContext);
      Memory::WriteBarrierPtr<void>::WriteBarrierSet
                (&pSVar2->normalizedSpecifier,normalizedSpecifier);
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_68);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
      JVar1 = JsNoError;
    }
    ((__enterScriptObject.library)->super_JavascriptLibraryBase).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)pSVar2;
  }
  return JVar1;
}

Assistant:

CHAKRA_API
JsInitializeModuleRecord(
    _In_opt_ JsModuleRecord referencingModule,
    _In_opt_ JsValueRef normalizedSpecifier,
    _Outptr_result_maybenull_ JsModuleRecord* moduleRecord)
{
    PARAM_NOT_NULL(moduleRecord);

    Js::SourceTextModuleRecord* newModuleRecord = nullptr;

    JsErrorCode errorCode = ContextAPIWrapper_NoRecord<true>([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        newModuleRecord = Js::SourceTextModuleRecord::Create(scriptContext);
        newModuleRecord->SetSpecifier(normalizedSpecifier);
        return JsNoError;
    });
    if (errorCode == JsNoError)
    {
        *moduleRecord = newModuleRecord;
    }
    else
    {
        *moduleRecord = JS_INVALID_REFERENCE;
    }
    return errorCode;
}